

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::Runner::runTest(Totals *__return_storage_ptr__,Runner *this,TestCaseInfo *testInfo)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
  *this_00;
  IReporter *pIVar1;
  TestCaseInfo *pTVar2;
  size_t sVar3;
  size_t sVar4;
  Totals *pTVar5;
  bool bVar6;
  int iVar7;
  RunningTest *pRVar8;
  IMutableContext *pIVar9;
  size_t sVar10;
  size_t sVar11;
  _Rb_tree_header *p_Var12;
  size_t sVar13;
  size_t sVar14;
  string redirectedCerr;
  string redirectedCout;
  string local_a8;
  string local_88;
  TestCaseInfo *local_68;
  Totals *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t sStack_40;
  
  local_58 = (this->m_totals).assertions.passed;
  local_50 = (this->m_totals).assertions.failed;
  local_48 = (this->m_totals).testCases.passed;
  sStack_40 = (this->m_totals).testCases.failed;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar1,testInfo);
  pRVar8 = (RunningTest *)operator_new(0x68);
  pRVar8->m_info = testInfo;
  pRVar8->m_runStatus = RanAtLeastOneSection;
  (pRVar8->m_rootSection).m_status = Root;
  p_Var12 = &(pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var12->_M_header;
  (pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var12->_M_header;
  *(undefined1 (*) [16])
   &(pRVar8->m_rootSection).m_subSections._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pRVar8->m_currentSection = &pRVar8->m_rootSection;
  pRVar8->m_changed = false;
  this->m_runningTest = pRVar8;
  local_68 = testInfo;
  local_60 = __return_storage_ptr__;
LAB_00186ac1:
  do {
    pTVar2 = this->m_runningTest->m_info;
    std::__cxx11::string::_M_assign((string *)&(this->m_currentResult).super_ResultInfo.m_lineInfo);
    std::__cxx11::string::_M_assign
              ((string *)&(this->m_currentResult).super_ResultInfo.m_lineInfo.file);
    (this->m_currentResult).super_ResultInfo.m_lineInfo.line = (pTVar2->m_lineInfo).line;
    runCurrentTest(this,&local_88,&local_a8);
    pRVar8 = this->m_runningTest;
    if ((pRVar8->m_runStatus == RanAtLeastOneSection) ||
       ((bVar6 = SectionInfo::hasUntestedSections(&pRVar8->m_rootSection), bVar6 &&
        (pRVar8->m_changed == true)))) {
      if ((this->m_totals).assertions.failed != (long)(this->m_config->m_data).cutoff)
      goto LAB_00186ac1;
    }
    pIVar9 = getCurrentMutableContext();
    iVar7 = (*(pIVar9->super_IContext)._vptr_IContext[5])(pIVar9);
    if (((char)iVar7 == '\0') ||
       ((this->m_totals).assertions.failed == (long)(this->m_config->m_data).cutoff)) {
      pRVar8 = this->m_runningTest;
      if (pRVar8 != (RunningTest *)0x0) {
        this_00 = &(pRVar8->m_rootSection).m_subSections;
        deleteAllValues<std::map<std::__cxx11::string,Catch::SectionInfo*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionInfo*>>>>
                  (this_00);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
        ::~_Rb_tree(&this_00->_M_t);
      }
      operator_delete(pRVar8,0x68);
      pTVar5 = local_60;
      this->m_runningTest = (RunningTest *)0x0;
      sVar10 = (this->m_totals).assertions.failed;
      (local_60->assertions).passed = (this->m_totals).assertions.passed - local_58;
      sVar10 = sVar10 - local_50;
      (local_60->assertions).failed = sVar10;
      sVar3 = (this->m_totals).testCases.passed;
      sVar4 = (this->m_totals).testCases.failed;
      sVar13 = sVar3 - local_48;
      sVar14 = sVar4 - sStack_40;
      sVar11 = sVar14;
      if (sVar10 == 0) {
        sVar11 = sVar13;
      }
      (local_60->testCases).passed = sVar13;
      (local_60->testCases).failed = sVar14;
      (&(local_60->testCases).passed)[sVar10 != 0] = sVar11 + 1;
      sVar10 = (local_60->testCases).failed;
      (this->m_totals).testCases.passed = (local_60->testCases).passed + sVar3;
      (this->m_totals).testCases.failed = sVar10 + sVar4;
      pIVar1 = (this->m_reporter).m_p;
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
                (pIVar1,local_68,local_60,&local_88,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      return pTVar5;
    }
  } while( true );
}

Assistant:

Totals runTest( const TestCaseInfo& testInfo ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            m_reporter->StartTestCase( testInfo );

            m_runningTest = new RunningTest( &testInfo );

            do {
                do {
                    m_currentResult.setLineInfo( m_runningTest->getTestCaseInfo().getLineInfo() );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            delete m_runningTest;
            m_runningTest = NULL;

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->EndTestCase( testInfo, deltaTotals, redirectedCout, redirectedCerr );
            return deltaTotals;
        }